

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

FilePath * __thiscall
testing::internal::FilePath::RemoveFileName(FilePath *__return_storage_ptr__,FilePath *this)

{
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  allocator local_6d [13];
  string local_60 [32];
  undefined1 local_40 [8];
  string dir;
  char *last_sep;
  FilePath *this_local;
  
  dir.field_2._8_8_ = FindLastPathSeparator(this);
  std::__cxx11::string::string((string *)local_40);
  if (dir.field_2._8_8_ == 0) {
    std::__cxx11::string::operator=((string *)local_40,"./");
  }
  else {
    pcVar1 = c_str(this);
    lVar2 = dir.field_2._8_8_ + 1;
    pcVar3 = c_str(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,pcVar1,lVar2 - (long)pcVar3,local_6d);
    std::__cxx11::string::operator=((string *)local_40,local_60);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)local_6d);
  }
  FilePath(__return_storage_ptr__,(string *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::RemoveFileName() const {
  const char* const last_sep = FindLastPathSeparator();
  std::string dir;
  if (last_sep) {
    dir = std::string(c_str(), last_sep + 1 - c_str());
  } else {
    dir = kCurrentDirectoryString;
  }
  return FilePath(dir);
}